

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O3

ssize_t Omega_h::gmsh::write(int __fd,void *__buf,size_t __n)

{
  int *piVar1;
  undefined8 uVar2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  I32 IVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  ostream *poVar9;
  undefined7 uVar11;
  undefined7 extraout_var;
  ssize_t sVar10;
  ssize_t extraout_RAX;
  undefined *puVar12;
  ulong uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  Mesh *this;
  long lVar15;
  Int ent_dim;
  undefined4 in_register_0000003c;
  int iVar16;
  int iVar17;
  long lVar18;
  string *psVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  element_type *peVar21;
  bool bVar22;
  HostRead<signed_char> h_class_dims;
  Read<signed_char> d_class_dims;
  Read<signed_char> d_class_dims_1;
  HostRead<int> h_ents2verts;
  HostRead<signed_char> h_class_dims_1;
  HostRead<int> h_class_ids;
  HostRead<double> h_coords;
  Reals d_coords;
  char local_15d;
  int local_15c;
  undefined1 local_158 [32];
  undefined8 local_138;
  string *local_130;
  Mesh *local_128;
  pointer local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  Alloc *local_110;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_f8;
  Read<signed_char> local_f0;
  Read<signed_char> local_e0;
  Read<signed_char> local_d0;
  Read<signed_char> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  Read<signed_char> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  HostRead<int> local_80;
  HostRead<signed_char> local_70;
  HostRead<int> local_60;
  HostRead<double> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  poVar9 = (ostream *)CONCAT44(in_register_0000003c,__fd);
  Omega_h::Mesh::comm((Mesh *)__buf);
  IVar5 = Comm::size((Comm *)local_158._0_8_);
  if (IVar5 != 1) {
    fail("assertion %s failed at %s +%d\n","mesh->comm()->size() == 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x2c6);
  }
  if ((element_type *)local_158._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$MeshFormat\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"2.2 0 ",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndMeshFormat\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$Nodes\n",7);
  uVar6 = Omega_h::Mesh::nverts((Mesh *)__buf);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar6);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  local_120 = (pointer)(ulong)*(uint *)((long)__buf + 4);
  if ((pointer)0x3 < local_120) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_128 = (Mesh *)__buf;
  Omega_h::Mesh::coords((Mesh *)&local_40);
  local_a0.write_.shared_alloc_.alloc = (Alloc *)local_40._M_pi;
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_40._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_38._M_pi;
  HostRead<double>::HostRead(&local_50,&local_a0);
  pAVar3 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)local_a0.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  lVar15 = *(long *)poVar9;
  lVar18 = *(long *)(lVar15 + -0x18);
  *(uint *)(poVar9 + lVar18 + 0x18) = *(uint *)(poVar9 + lVar18 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar15 + -0x18) + 8) = 0x11;
  if (0 < (int)uVar6) {
    uVar7 = (uint)local_120;
    local_130 = (string *)0x1;
    if (1 < uVar7) {
      local_130 = (string *)((ulong)local_120 & 0xffffffff);
    }
    local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
    local_138 = (long)local_120 * 8;
    p_Var14 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_15c = 2 - uVar7;
    if (2 < uVar7) {
      local_15c = 0;
    }
    local_15c = local_15c + 1;
    local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      local_100._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_100._M_pi)->_vptr__Sp_counted_base + 1);
      std::ostream::operator<<((ostream *)poVar9,(int)local_100._M_pi);
      psVar19 = local_130;
      iVar16 = local_15c;
      local_f8 = p_Var14;
      if (local_120 == (pointer)0x0) {
LAB_002d40a0:
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," 0",2);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      else {
        do {
          local_158[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_158,1);
          std::ostream::_M_insert<double>
                    (*(double *)
                      ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                              &p_Var14->_M_pi)->_M_ptr +
                      (long)(_func_int ***)local_50.read_.write_.shared_alloc_.direct_ptr));
          p_Var14 = p_Var14 + 1;
          psVar19 = (string *)((long)psVar19 - 1);
        } while (psVar19 != (string *)0x0);
        iVar16 = local_15c;
        if ((uint)local_120 != 3) goto LAB_002d40a0;
      }
      local_158[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_158,1);
      p_Var14 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_f8->_M_pi)->_M_ptr + local_138);
    } while (local_100._M_pi != local_118);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndNodes\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$Elements\n",10);
  iVar16 = 0;
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_118._4_4_,local_128->family_);
  this = local_128;
  uVar6 = 0;
  do {
    uVar7 = Omega_h::Mesh::nents(this,uVar6);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_dim","");
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&local_110,(Int)local_128,(string *)(ulong)uVar6);
    if ((Alloc *)local_158._0_8_ != (Alloc *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    local_c0.write_.shared_alloc_.alloc = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_c0.write_.shared_alloc_.direct_ptr = local_108;
    HostRead<signed_char>::HostRead((HostRead<signed_char> *)local_158,&local_c0);
    pAVar3 = local_c0.write_.shared_alloc_.alloc;
    if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_c0.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    this = local_128;
    uVar2 = local_158._0_8_;
    if (0 < (int)uVar7) {
      uVar13 = 0;
      do {
        iVar16 = iVar16 + (uint)(uVar6 == (int)*(char *)((long)(Library **)local_158._8_8_ + uVar13)
                                );
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_158._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_158._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    pAVar3 = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(pAVar3,0x48);
      }
    }
    bVar22 = uVar6 != (uint)local_120;
    iVar17 = (int)local_118;
    uVar6 = uVar6 + 1;
  } while (bVar22);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar16);
  local_158[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_158,1);
  psVar19 = (string *)0x0;
  local_15c = 0;
  do {
    local_130 = psVar19;
    uVar6 = Omega_h::Mesh::nents(this,(Int)psVar19);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_id","");
    ent_dim = (Int)this;
    Omega_h::Mesh::get_array<int>((Mesh *)&local_110,ent_dim,local_130);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"class_dim","");
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&local_b0,ent_dim,local_130);
    if ((Alloc *)local_158._0_8_ != (Alloc *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
    }
    Omega_h::Mesh::ask_verts_of((Mesh *)local_158,ent_dim);
    local_d0.write_.shared_alloc_.alloc = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_d0.write_.shared_alloc_.direct_ptr = local_108;
    HostRead<int>::HostRead(&local_60,&local_d0);
    pAVar3 = local_d0.write_.shared_alloc_.alloc;
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_e0.write_.shared_alloc_.alloc = (Alloc *)local_b0._M_pi;
    if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_b0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_e0.write_.shared_alloc_.direct_ptr = local_a8;
    HostRead<signed_char>::HostRead(&local_70,&local_e0);
    pAVar3 = local_e0.write_.shared_alloc_.alloc;
    if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_f0.write_.shared_alloc_.alloc = (Alloc *)local_158._0_8_;
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_158._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_158._0_8_ + 0x30) = *(int *)(local_158._0_8_ + 0x30) + 1;
      }
    }
    local_f0.write_.shared_alloc_.direct_ptr = (void *)local_158._8_8_;
    HostRead<int>::HostRead(&local_80,&local_f0);
    pAVar3 = local_f0.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if (iVar17 == 0) {
      if (3 < (uint)local_130) goto switchD_002d4595_default;
      local_138 = CONCAT44(local_138._4_4_,(int)CONCAT71((int7)((ulong)local_130 >> 8),1));
      switch((ulong)local_130 & 0xffffffff) {
      case 0:
        uVar7 = 1;
        break;
      case 1:
        uVar7 = 2;
        break;
      case 2:
        uVar7 = 3;
        break;
      case 3:
        uVar7 = 4;
      }
    }
    else {
      switch((ulong)local_130 & 0xffffffff) {
      case 0:
        uVar7 = 1;
        break;
      case 1:
        uVar7 = 2;
        break;
      case 2:
        uVar7 = 4;
        break;
      case 3:
        uVar7 = 8;
        break;
      default:
switchD_002d4595_default:
        uVar7 = 0xffffffff;
        local_138 = (ulong)local_138._4_4_ << 0x20;
        goto LAB_002d45e8;
      }
      local_138 = CONCAT44(local_138._4_4_,0x448c01);
    }
LAB_002d45e8:
    if (0 < (int)uVar6) {
      local_88 = (element_type *)0x1;
      if (1 < (int)uVar7) {
        local_88 = (element_type *)(ulong)uVar7;
      }
      local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar6;
      local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)(uint)local_130;
      local_f8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(int)uVar7 << 2);
      lVar15 = 0;
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      psVar19 = local_130;
      do {
        if ((uint)psVar19 ==
            (int)*(char *)((long)&p_Var20->_vptr__Sp_counted_base +
                          (long)(_func_int ***)local_70.read_.write_.shared_alloc_.direct_ptr)) {
          local_15c = local_15c + 1;
          std::ostream::operator<<((ostream *)poVar9,local_15c);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          iVar16 = -1;
          if (iVar17 == 1) {
            puVar12 = &DAT_00448f2c;
joined_r0x002d4782:
            if ((uint)psVar19 < 4) {
              iVar16 = *(int *)(puVar12 + (long)local_90._M_pi * 4);
            }
          }
          else if (iVar17 == 0) {
            puVar12 = &DAT_00448f1c;
            goto joined_r0x002d4782;
          }
          std::ostream::operator<<((ostream *)poVar8,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," 2",2);
          iVar16 = *(int *)((long)(_func_int ***)local_60.read_.write_.shared_alloc_.direct_ptr +
                           (long)p_Var20 * 4);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar16);
          local_15d = ' ';
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_15d,1);
          std::ostream::operator<<((ostream *)poVar8,iVar16);
          lVar18 = lVar15;
          peVar21 = local_88;
          if ((char)local_138 != '\0') {
            do {
              local_15d = ' ';
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
              std::ostream::operator<<
                        ((ostream *)poVar8,
                         *(int *)((long)(_func_int ***)
                                        local_80.read_.write_.shared_alloc_.direct_ptr + lVar18) + 1
                        );
              lVar18 = lVar18 + 4;
              peVar21 = (element_type *)
                        ((long)&peVar21[-1].codes.write_.shared_alloc_.direct_ptr + 7);
            } while (peVar21 != (element_type *)0x0);
          }
          local_15d = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_15d,1);
          psVar19 = local_130;
          iVar17 = (int)local_118;
        }
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var20->_vptr__Sp_counted_base + 1);
        lVar15 = (long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_f8->_M_pi)->_M_ptr + lVar15;
      } while (p_Var20 != local_100._M_pi);
    }
    pAVar3 = local_80.read_.write_.shared_alloc_.alloc;
    if (((ulong)local_80.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_80.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_80.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_70.read_.write_.shared_alloc_.alloc;
    this = local_128;
    if (((ulong)local_70.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_70.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_70.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_60.read_.write_.shared_alloc_.alloc;
    if (((ulong)local_60.read_.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)local_60.read_.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_60.read_.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar2 = local_158._0_8_;
    if ((local_158._0_8_ & 7) == 0 && (Alloc *)local_158._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_158._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_158._0_8_);
        operator_delete((void *)uVar2,0x48);
      }
    }
    _Var4._M_pi = local_b0._M_pi;
    if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
      p_Var20 = local_b0._M_pi + 3;
      *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_b0._M_pi);
        operator_delete(_Var4._M_pi,0x48);
      }
    }
    pAVar3 = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(pAVar3,0x48);
      }
    }
    psVar19 = (string *)(ulong)((int)local_130 + 1);
    if ((int)local_130 == (uint)local_120) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$EndElements\n",0xd);
      uVar11 = (undefined7)((ulong)poVar9 >> 8);
      if (((ulong)local_50.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_50.read_.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_50.read_.write_.shared_alloc_.alloc);
          operator_delete(local_50.read_.write_.shared_alloc_.alloc,0x48);
          uVar11 = extraout_var;
        }
      }
      sVar10 = CONCAT71(uVar11,(Alloc *)local_40._M_pi == (Alloc *)0x0);
      if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
        p_Var20 = local_40._M_pi + 3;
        *(int *)&p_Var20->_vptr__Sp_counted_base = *(int *)&p_Var20->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var20->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_40._M_pi);
          operator_delete(local_40._M_pi,0x48);
          sVar10 = extraout_RAX;
        }
      }
      return sVar10;
    }
  } while( true );
}

Assistant:

void write(std::ostream& stream, Mesh* mesh) {
  OMEGA_H_CHECK(mesh->comm()->size() == 1);
  stream << "$MeshFormat\n";
  stream << "2.2 0 " << sizeof(Real) << '\n';
  stream << "$EndMeshFormat\n";
  stream << "$Nodes\n";
  auto nverts = mesh->nverts();
  stream << nverts << '\n';
  auto dim = mesh->dim();
  auto d_coords = mesh->coords();
  auto h_coords = HostRead<Real>(d_coords);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < nverts; ++i) {
    stream << (i + 1);
    for (Int j = 0; j < dim; ++j) stream << ' ' << h_coords[i * dim + j];
    for (Int j = dim; j < 3; ++j) stream << " 0";
    stream << '\n';
  }
  stream << "$EndNodes\n";
  stream << "$Elements\n";
  LO gmsh_elem_i = 0;
  auto family = mesh->family();
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] == ent_dim) ++gmsh_elem_i;
    }
  }
  auto gmsh_nelems = gmsh_elem_i;
  stream << gmsh_nelems << '\n';
  gmsh_elem_i = 0;
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_ids = mesh->get_array<ClassId>(ent_dim, "class_id");
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto d_ents2verts = mesh->ask_verts_of(ent_dim);
    auto h_class_ids = HostRead<ClassId>(d_class_ids);
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    auto h_ents2verts = HostRead<LO>(d_ents2verts);
    auto deg = element_degree(family, ent_dim, VERT);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] != ent_dim) continue;
      stream << ++gmsh_elem_i;
      stream << ' ' << gmsh_type(family, ent_dim);
      stream << " 2";
      auto class_id = h_class_ids[i];
      stream << ' ' << class_id << ' ' << class_id;
      for (Int j = 0; j < deg; ++j) {
        stream << ' ' << (h_ents2verts[i * deg + j] + 1);
      }
      stream << '\n';
    }
  }
  stream << "$EndElements\n";
}